

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MapFieldGenerator::GenerateSerializeWithCachedSizes
          (MapFieldGenerator *this,Printer *printer,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *variables)

{
  bool bVar1;
  Type TVar2;
  Type TVar3;
  Descriptor *pDVar4;
  FieldDescriptor *this_00;
  FieldDescriptor *this_01;
  char *pcVar5;
  string utf8_check;
  allocator local_a2;
  allocator local_a1;
  string local_a0;
  string local_80;
  FieldDescriptor *local_60;
  FieldDescriptor *local_58;
  string local_50;
  
  io::Printer::Print(printer,variables,"if (!this->$name$().empty()) {\n");
  io::Printer::Indent(printer);
  pDVar4 = FieldDescriptor::message_type(this->descriptor_);
  std::__cxx11::string::string((string *)&local_a0,"key",(allocator *)&local_80);
  this_00 = Descriptor::FindFieldByName(pDVar4,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  pDVar4 = FieldDescriptor::message_type(this->descriptor_);
  std::__cxx11::string::string((string *)&local_a0,"value",(allocator *)&local_80);
  this_01 = Descriptor::FindFieldByName(pDVar4,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  local_58 = this_00;
  TVar2 = FieldDescriptor::type(this_00);
  local_60 = this_01;
  TVar3 = FieldDescriptor::type(this_01);
  io::Printer::Print(printer,variables,
                     "typedef ::google::protobuf::Map< $key_cpp$, $val_cpp$ >::const_pointer\n    ConstPtr;\n"
                    );
  pcVar5 = 
  "typedef ::google::protobuf::internal::SortItem< $key_cpp$, ConstPtr > SortItem;\ntypedef ::google::protobuf::internal::CompareByFirstField<SortItem> Less;\n"
  ;
  if (TVar2 == TYPE_STRING) {
    pcVar5 = 
    "typedef ConstPtr SortItem;\ntypedef ::google::protobuf::internal::CompareByDerefFirst<SortItem> Less;\n"
    ;
  }
  io::Printer::Print(printer,variables,pcVar5);
  local_a0._M_string_length = 0;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0.field_2._M_local_buf[0] = '\0';
  if ((TVar2 == TYPE_STRING) || (TVar3 == TYPE_STRING)) {
    io::Printer::Print(printer,"struct Utf8Check {\n  static void Check(ConstPtr p) {\n");
    io::Printer::Indent(printer);
    io::Printer::Indent(printer);
    if (TVar2 == TYPE_STRING) {
      GenerateUtf8CheckCodeForString
                (local_58,(this->super_FieldGenerator).options_,false,variables,
                 "p->first.data(), p->first.length(),\n",printer);
    }
    if (TVar3 == TYPE_STRING) {
      GenerateUtf8CheckCodeForString
                (local_60,(this->super_FieldGenerator).options_,false,variables,
                 "p->second.data(), p->second.length(),\n",printer);
    }
    io::Printer::Outdent(printer);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"  }\n};\n");
    std::__cxx11::string::assign((char *)&local_a0);
  }
  io::Printer::Print(printer,variables,
                     "\nif ($deterministic$ &&\n    this->$name$().size() > 1) {\n  ::google::protobuf::scoped_array<SortItem> items(\n      new SortItem[this->$name$().size()]);\n  typedef ::google::protobuf::Map< $key_cpp$, $val_cpp$ >::size_type size_type;\n  size_type n = 0;\n  for (::google::protobuf::Map< $key_cpp$, $val_cpp$ >::const_iterator\n      it = this->$name$().begin();\n      it != this->$name$().end(); ++it, ++n) {\n    items[n] = SortItem(&*it);\n  }\n  ::std::sort(&items[0], &items[n], Less());\n"
                    );
  io::Printer::Indent(printer);
  bVar1 = *(bool *)(*(long *)(*(long *)(this->descriptor_ + 0x30) + 0xa0) + 0xa7);
  std::__cxx11::string::string((string *)&local_80,"for (size_type i = 0; i < n; i++)",&local_a1);
  pcVar5 = "items[i].second";
  if (TVar2 == TYPE_STRING) {
    pcVar5 = "items[i]";
  }
  std::__cxx11::string::string((string *)&local_50,pcVar5,&local_a2);
  GenerateSerializationLoop(printer,variables,bVar1,&local_a0,&local_80,&local_50,false);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_80);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"} else {\n");
  io::Printer::Indent(printer);
  bVar1 = *(bool *)(*(long *)(*(long *)(this->descriptor_ + 0x30) + 0xa0) + 0xa7);
  std::__cxx11::string::string
            ((string *)&local_80,
             "for (::google::protobuf::Map< $key_cpp$, $val_cpp$ >::const_iterator\n    it = this->$name$().begin();\n    it != this->$name$().end(); ++it)"
             ,&local_a1);
  std::__cxx11::string::string((string *)&local_50,"it",&local_a2);
  GenerateSerializationLoop(printer,variables,bVar1,&local_a0,&local_80,&local_50,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_80);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

void MapFieldGenerator::GenerateSerializeWithCachedSizes(
    io::Printer* printer, const std::map<string, string>& variables) const {
  printer->Print(variables,
      "if (!this->$name$().empty()) {\n");
  printer->Indent();
  const FieldDescriptor* key_field =
      descriptor_->message_type()->FindFieldByName("key");
  const FieldDescriptor* value_field =
      descriptor_->message_type()->FindFieldByName("value");
  const bool string_key = key_field->type() == FieldDescriptor::TYPE_STRING;
  const bool string_value = value_field->type() == FieldDescriptor::TYPE_STRING;

  printer->Print(variables,
      "typedef ::google::protobuf::Map< $key_cpp$, $val_cpp$ >::const_pointer\n"
      "    ConstPtr;\n");
  if (string_key) {
    printer->Print(variables,
        "typedef ConstPtr SortItem;\n"
        "typedef ::google::protobuf::internal::"
        "CompareByDerefFirst<SortItem> Less;\n");
  } else {
    printer->Print(variables,
        "typedef ::google::protobuf::internal::SortItem< $key_cpp$, ConstPtr > "
        "SortItem;\n"
        "typedef ::google::protobuf::internal::CompareByFirstField<SortItem> Less;\n");
  }
  string utf8_check;
  if (string_key || string_value) {
    printer->Print(
        "struct Utf8Check {\n"
        "  static void Check(ConstPtr p) {\n");
    printer->Indent();
    printer->Indent();
    if (string_key) {
      GenerateUtf8CheckCodeForString(key_field, options_, false, variables,
                                     "p->first.data(), p->first.length(),\n",
                                     printer);
    }
    if (string_value) {
      GenerateUtf8CheckCodeForString(value_field, options_, false, variables,
                                     "p->second.data(), p->second.length(),\n",
                                     printer);
    }
    printer->Outdent();
    printer->Outdent();
    printer->Print(
        "  }\n"
        "};\n");
    utf8_check = "Utf8Check::Check";
  }

  printer->Print(variables,
      "\n"
      "if ($deterministic$ &&\n"
      "    this->$name$().size() > 1) {\n"
      "  ::google::protobuf::scoped_array<SortItem> items(\n"
      "      new SortItem[this->$name$().size()]);\n"
      "  typedef ::google::protobuf::Map< $key_cpp$, $val_cpp$ >::size_type size_type;\n"
      "  size_type n = 0;\n"
      "  for (::google::protobuf::Map< $key_cpp$, $val_cpp$ >::const_iterator\n"
      "      it = this->$name$().begin();\n"
      "      it != this->$name$().end(); ++it, ++n) {\n"
      "    items[n] = SortItem(&*it);\n"
      "  }\n"
      "  ::std::sort(&items[0], &items[n], Less());\n");
  printer->Indent();
  GenerateSerializationLoop(printer, variables, SupportsArenas(descriptor_),
                            utf8_check, "for (size_type i = 0; i < n; i++)",
                            string_key ? "items[i]" : "items[i].second", false);
  printer->Outdent();
  printer->Print(
      "} else {\n");
  printer->Indent();
  GenerateSerializationLoop(
      printer, variables, SupportsArenas(descriptor_), utf8_check,
      "for (::google::protobuf::Map< $key_cpp$, $val_cpp$ >::const_iterator\n"
      "    it = this->$name$().begin();\n"
      "    it != this->$name$().end(); ++it)",
      "it", true);
  printer->Outdent();
  printer->Print("}\n");
  printer->Outdent();
  printer->Print("}\n");
}